

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

Table * __thiscall
Table::slice(Table *__return_storage_ptr__,Table *this,int l_col,int r_col,int l_row,int r_row)

{
  int iVar1;
  types tVar2;
  pointer ptVar3;
  int j;
  long lVar4;
  long lVar5;
  int cnt;
  long lVar6;
  long lVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_columns;
  string local_90;
  string local_70;
  string local_50;
  
  new_columns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_columns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_columns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = (long)l_col;
  lVar4 = lVar6 * 0x28 + 8;
  for (lVar7 = lVar6; lVar7 < r_col; lVar7 = lVar7 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&new_columns,
                (value_type *)
                ((long)&(((this->columns).
                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                        ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int> +
                lVar4));
    lVar4 = lVar4 + 0x28;
  }
  Table(__return_storage_ptr__,&new_columns);
  lVar7 = (long)l_row;
  lVar4 = (long)r_row;
  do {
    if (r_col <= lVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&new_columns);
      return __return_storage_ptr__;
    }
    cnt = (int)lVar6 - l_col;
    define_column_type(__return_storage_ptr__,cnt,
                       (this->columns).
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar6].
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                       .super__Tuple_impl<1UL,_Table::types,_int>.
                       super__Head_base<1UL,_Table::types,_false>._M_head_impl);
    ptVar3 = (this->columns).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar1 = *(int *)&ptVar3[lVar6].
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                     .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
    tVar2 = ptVar3[lVar6].
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
            .super__Tuple_impl<1UL,_Table::types,_int>.super__Head_base<1UL,_Table::types,_false>.
            _M_head_impl;
    lVar5 = lVar7;
    if (tVar2 == FLOAT) {
      for (; lVar5 < lVar4; lVar5 = lVar5 + 1) {
        std::__cxx11::to_string
                  (&local_70,
                   *(double *)
                    (*(long *)&(this->float_cols).
                               super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar1].second.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar5 * 8));
        push_new_value_in_column(__return_storage_ptr__,cnt,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    else if (tVar2 == INT) {
      for (; lVar5 < lVar4; lVar5 = lVar5 + 1) {
        std::__cxx11::to_string
                  (&local_50,
                   *(longlong *)
                    (*(long *)&(this->int_cols).
                               super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar1].second.
                               super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl +
                    lVar5 * 8));
        push_new_value_in_column(__return_storage_ptr__,cnt,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      lVar8 = lVar7 << 5;
      if (tVar2 != STRING) {
        std::operator<<((ostream *)&std::cerr,"slice\n");
        exit(1);
      }
      for (; lVar5 < lVar4; lVar5 = lVar5 + 1) {
        std::__cxx11::string::string
                  ((string *)&local_90,
                   (string *)
                   (*(long *)&(this->string_cols).
                              super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar1].second.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl + lVar8));
        push_new_value_in_column(__return_storage_ptr__,cnt,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        lVar8 = lVar8 + 0x20;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

Table Table::slice(int l_col, int r_col, int l_row, int r_row){
    std::vector<std::string> new_columns;
    for (int i = l_col; i < r_col; ++i)
        new_columns.push_back(std::get<0>(columns[i]));
    Table t(new_columns);
    for (int i = l_col; i < r_col; ++i){
        t.define_column_type(i-l_col, std::get<1>(columns[i]));
        int cnt = std::get<2>(columns[i]);
        switch (std::get<1>(columns[i])) {
            case INT:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, std::to_string(int_cols[cnt].second[j]));
                break;
            case FLOAT:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, std::to_string(float_cols[cnt].second[j]));
                break;
            case STRING:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, string_cols[cnt].second[j]);
                break;
            default:
                std::cerr << "slice\n";
                exit(EXIT_FAILURE);
        }
    }
    return t;
}